

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::ComplainAboutBadComponent
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,int c,bool strong)

{
  int iVar1;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  TargetType targetType;
  string *psVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  pointer pcVar9;
  long lVar10;
  int *piVar11;
  pointer pcVar12;
  ostringstream e;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"The inter-target dependency graph contains the following ",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"strongly connected component (cycle):\n",0x26);
  pcVar2 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar11 = *(int **)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl;
  if (piVar11 !=
      *(pointer *)
       ((long)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)) {
    do {
      iVar1 = *piVar11;
      pcVar3 = (this->Targets).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar1];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  \"",3);
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" of type ",10);
      targetType = cmGeneratorTarget::GetType(pcVar3);
      pcVar7 = cmState::GetTargetTypeName(targetType);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      pcVar4 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar12 = *(pointer *)
                 &pcVar4[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar9 = *(pointer *)
                ((long)&pcVar4[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      if (pcVar12 != pcVar9) {
        do {
          if ((ccg->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[pcVar12->Dest] == c) {
            pcVar3 = (this->Targets).
                     super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[pcVar12->Dest];
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"    depends on \"",0x10);
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,
                                psVar5->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
            pcVar7 = "weak";
            if (pcVar12->Strong != false) {
              pcVar7 = "strong";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,pcVar7,(ulong)pcVar12->Strong * 2 + 4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
            pcVar9 = *(pointer *)
                      ((long)&pcVar4[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                              super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar9);
      }
      piVar11 = piVar11 + 1;
    } while (piVar11 !=
             *(pointer *)
              ((long)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8));
  }
  if (strong) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "The component contains at least one cycle consisting of strong ",0x3f);
    lVar10 = 0x41;
    pcVar7 = "dependencies (created by add_dependencies) that cannot be broken.";
  }
  else if (this->NoCycles == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so ",
               0x3c);
    lVar10 = 0x40;
    pcVar7 = "cyclic dependencies are not allowed even among static libraries.";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"At least one of these targets is not a STATIC_LIBRARY.  ",0x38)
    ;
    lVar10 = 0x3c;
    pcVar7 = "Cyclic dependencies are allowed only among static libraries.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar10);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error((char *)local_1c8,(char *)0x0,(char *)0x0,(char *)0x0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmComputeTargetDepends::ComplainAboutBadComponent(
  cmComputeComponentGraph const& ccg, int c, bool strong)
{
  // Construct the error message.
  std::ostringstream e;
  e << "The inter-target dependency graph contains the following "
    << "strongly connected component (cycle):\n";
  std::vector<NodeList> const& components = ccg.GetComponents();
  std::vector<int> const& cmap = ccg.GetComponentMap();
  NodeList const& cl = components[c];
  for (NodeList::const_iterator ci = cl.begin(); ci != cl.end(); ++ci) {
    // Get the depender.
    int i = *ci;
    cmGeneratorTarget const* depender = this->Targets[i];

    // Describe the depender.
    e << "  \"" << depender->GetName() << "\" of type "
      << cmState::GetTargetTypeName(depender->GetType()) << "\n";

    // List its dependencies that are inside the component.
    EdgeList const& nl = this->InitialGraph[i];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int j = *ni;
      if (cmap[j] == c) {
        cmGeneratorTarget const* dependee = this->Targets[j];
        e << "    depends on \"" << dependee->GetName() << "\""
          << " (" << (ni->IsStrong() ? "strong" : "weak") << ")\n";
      }
    }
  }
  if (strong) {
    // Custom command executable dependencies cannot occur within a
    // component of static libraries.  The cycle must appear in calls
    // to add_dependencies.
    e << "The component contains at least one cycle consisting of strong "
      << "dependencies (created by add_dependencies) that cannot be broken.";
  } else if (this->NoCycles) {
    e << "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so "
      << "cyclic dependencies are not allowed even among static libraries.";
  } else {
    e << "At least one of these targets is not a STATIC_LIBRARY.  "
      << "Cyclic dependencies are allowed only among static libraries.";
  }
  cmSystemTools::Error(e.str().c_str());
}